

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2metrics.h
# Opt level: O2

int __thiscall S2::Metric<1>::GetLevelForMaxValue(Metric<1> *this,double value)

{
  int iVar1;
  int iVar2;
  double dVar3;
  S2LogMessage local_28;
  
  if (value <= 0.0) {
    iVar2 = 0x1e;
  }
  else {
    iVar1 = ilogb(value / this->deriv_);
    iVar2 = 0x1e;
    if (-0x1e < iVar1) {
      iVar2 = -iVar1;
    }
    iVar1 = 0;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    if (iVar2 != 0x1e) {
      dVar3 = GetValue(this,iVar1);
      if (value < dVar3) {
        S2LogMessage::S2LogMessage
                  (&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2metrics.h"
                   ,0xae,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_28.stream_,
                        "Check failed: level == S2::kMaxCellLevel || GetValue(level) <= value ");
        goto LAB_001dd991;
      }
      if (iVar2 < 1) {
        return 0;
      }
    }
    dVar3 = GetValue(this,iVar1 + -1);
    if (dVar3 <= value) {
      S2LogMessage::S2LogMessage
                (&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2metrics.h"
                 ,0xaf,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_28.stream_,"Check failed: level == 0 || GetValue(level - 1) > value ");
LAB_001dd991:
      abort();
    }
  }
  return iVar2;
}

Assistant:

int S2::Metric<dim>::GetLevelForMaxValue(double value) const {
  if (value <= 0) return S2::kMaxCellLevel;

  // This code is equivalent to computing a floating-point "level"
  // value and rounding up.  ilogb() returns the exponent corresponding to a
  // fraction in the range [1,2).
  int level = ilogb(value / deriv_);
  level = std::max(0, std::min(S2::kMaxCellLevel, -(level >> (dim - 1))));
  S2_DCHECK(level == S2::kMaxCellLevel || GetValue(level) <= value);
  S2_DCHECK(level == 0 || GetValue(level - 1) > value);
  return level;
}